

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O1

hFILE * hdopen(int fd,char *mode)

{
  int iVar1;
  hFILE *phVar2;
  char *pcVar3;
  size_t capacity;
  hFILE *phVar4;
  stat sbuf;
  stat local_b0;
  
  iVar1 = fstat(fd,&local_b0);
  capacity = 0;
  if (iVar1 == 0) {
    capacity = local_b0.st_blksize;
  }
  phVar2 = hfile_init(0x40,mode,capacity);
  phVar4 = (hFILE *)0x0;
  if (phVar2 != (hFILE *)0x0) {
    *(int *)&phVar2[1].buffer = fd;
    pcVar3 = strchr(mode,0x73);
    *(byte *)((long)&phVar2[1].buffer + 4) =
         *(byte *)((long)&phVar2[1].buffer + 4) & 0xfe | pcVar3 != (char *)0x0;
    phVar2->backend = &fd_backend;
    phVar4 = phVar2;
  }
  return phVar4;
}

Assistant:

hFILE *hdopen(int fd, const char *mode)
{
    hFILE_fd *fp = (hFILE_fd*) hfile_init(sizeof (hFILE_fd), mode, blksize(fd));
    if (fp == NULL) return NULL;

    fp->fd = fd;
    fp->is_socket = (strchr(mode, 's') != NULL);
    fp->base.backend = &fd_backend;
    return &fp->base;
}